

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_print.c
# Opt level: O1

err_t cmdPrintMem2(void *buf,size_t count)

{
  err_t eVar1;
  char *dest;
  
  dest = (char *)blobCreate(0x20);
  if (dest == (char *)0x0) {
    eVar1 = 0x6e;
  }
  else {
    if (count < 0xf) {
      hexFrom(dest,buf,count);
      printf("%s",dest);
    }
    else {
      hexFrom(dest,buf,0xc);
      dest[0x1a] = '.';
      dest[0x18] = '.';
      dest[0x19] = '.';
      hexFrom(dest + 0x1b,(void *)((long)buf + (count - 2)),2);
      printf("%s (%u)",dest,count & 0xffffffff);
    }
    blobClose(dest);
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

err_t cmdPrintMem2(const void* buf, size_t count)
{
	char* hex;
	// pre
	ASSERT(memIsValid(buf, count));
	// выделить память
	hex = (char*)blobCreate(32);
	if (!hex)
		return ERR_OUTOFMEMORY;
	// печатать
	if (count > 14)
	{
		hexFrom(hex, buf, 12);
		hex[24] = hex[25] = hex[26] = '.';
		hexFrom(hex + 27, (const octet*)buf + count - 2, 2);
		printf("%s (%u)", hex, (unsigned)count);
	}
	else
	{
		hexFrom(hex, buf, count);
		printf("%s", hex);
	}
	// завершить
	blobClose(hex);
	return ERR_OK;
}